

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O2

void vociadd(voccxdef *ctx,objnum obj,objnum loc,int numsc,objnum *sc,int flags)

{
  void *__dest;
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  uint uVar4;
  undefined4 in_register_0000000c;
  vocidef *pvVar5;
  vocidef *pvVar6;
  uint uVar7;
  anon_union_8_2_176b10ea_for_vociu *paVar8;
  vocidef *pvVar9;
  vocidef *pvVar10;
  ulong uVar11;
  
  pvVar5 = (vocidef *)CONCAT44(in_register_0000000c,numsc);
  vocialo(ctx,obj);
  pvVar9 = (vocidef *)0x0;
  pvVar6 = (vocidef *)0x0;
  paVar8 = (anon_union_8_2_176b10ea_for_vociu *)&ctx->voccxifr;
  while (pvVar10 = paVar8->vociunxt, pvVar10 != (vocidef *)0x0) {
    bVar1 = pvVar10->vocinsc;
    if ((uint)bVar1 == numsc) goto LAB_00134840;
    if ((numsc < (int)(uint)bVar1) && ((pvVar9 == (vocidef *)0x0 || (bVar1 < pvVar9->vocinsc)))) {
      pvVar5 = pvVar6;
      pvVar9 = pvVar10;
    }
    pvVar6 = pvVar10;
    paVar8 = &pvVar10->vociu;
  }
  pvVar6 = pvVar5;
  pvVar10 = pvVar9;
  if (pvVar9 == (vocidef *)0x0) {
    uVar7 = numsc * 2 + 0x15U & 0xfffffff8;
    uVar4 = ctx->voccxilst;
    if (0x1fff < uVar4 + uVar7) {
      puVar2 = mchalo(ctx->voccxerr,0x2000,"vociadd");
      uVar4 = ctx->voccxiplst + 1;
      ctx->voccxiplst = uVar4;
      ctx->voccxip[uVar4] = puVar2;
      ctx->voccxilst = 0;
      uVar4 = 0;
    }
    pvVar10 = (vocidef *)(ctx->voccxip[ctx->voccxiplst] + uVar4);
    ctx->voccxilst = uVar7 + uVar4;
  }
  else {
LAB_00134840:
    if (pvVar6 == (vocidef *)0x0) {
      ctx->voccxifr = (vocidef *)pvVar10->vociu;
    }
    else {
      pvVar6->vociu = pvVar10->vociu;
    }
  }
  if (ctx->voccxinh[obj >> 8][(byte)obj] != (vocidef *)0x0) {
    errsigf(ctx->voccxerr,"TADS",0x1c2);
  }
  (pvVar10->vociu).vocius.vociusloc = loc;
  (pvVar10->vociu).vocius.vociusilc = 0xffff;
  (pvVar10->vociu).vocius.vociusflg = (byte)flags & 0xfb;
  pvVar10->vocinsc = (uchar)numsc;
  if (numsc != 0) {
    __dest = (void *)((long)&pvVar10->vociu + 6);
    if ((flags & 4U) == 0) {
      memcpy(__dest,sc,(long)numsc * 2);
    }
    else {
      uVar3 = 0;
      uVar11 = (ulong)(uint)numsc;
      if (numsc < 1) {
        uVar11 = uVar3;
      }
      for (; uVar11 != uVar3; uVar3 = uVar3 + 1) {
        *(objnum *)((long)__dest + uVar3 * 2) = sc[uVar3];
      }
    }
  }
  ctx->voccxinh[obj >> 8][(byte)obj] = pvVar10;
  return;
}

Assistant:

void vociadd(voccxdef *ctx, objnum obj, objnum loc,
             int numsc, objnum *sc, int flags)
{
    vocidef *v;
    vocidef *min;
    vocidef *prv;
    vocidef *minprv;

    /* make sure we have a page table entry for this object */
    vocialo(ctx, obj);

    /* look in free list for an entry that's big enough */
    for (prv = (vocidef *)0, min = (vocidef *)0, v = ctx->voccxifr ; v ;
         prv = v, v = v->vocinxt)
    {
        if (v->vocinsc == numsc)
        {
            min = v;
            minprv = prv;
            break;
        }
        else if (v->vocinsc > numsc)
        {
            if (!min || v->vocinsc < min->vocinsc)
            {
                min = v;
                minprv = prv;
            }
        }
    }
    
    if (!min)
    {
        uint need;
        
        /* nothing in free list; allocate a new entry */
        need = osrndsz(sizeof(vocidef) + (numsc - 1)*sizeof(objnum));
        if (ctx->voccxilst + need >= VOCISIZ)
        {
            /* nothing left on current page; allocate a new page */
            ctx->voccxip[++(ctx->voccxiplst)] =
                mchalo(ctx->voccxerr, VOCISIZ, "vociadd");
            ctx->voccxilst = 0;
        }

        /* allocate space out of current page */
        v = (vocidef *)(ctx->voccxip[ctx->voccxiplst] + ctx->voccxilst);
        ctx->voccxilst += need;
    }
    else
    {
        /* unlink from chain and use */
        v = min;
        if (minprv)
            minprv->vocinxt = v->vocinxt;
        else
            ctx->voccxifr = v->vocinxt;
    }

    /* set up the entry */
    if (vocinh(ctx, obj) != (vocidef *)0) errsig(ctx->voccxerr, ERR_VOCINUS);
    v->vociloc = loc;
    v->vociilc = MCMONINV;
    v->vociflg = (flags & ~VOCIFXLAT);
    v->vocinsc = numsc;
    if (numsc)
    {
        if (flags & VOCIFXLAT)
        {
            int i;
            
            for (i = 0 ; i < numsc ; ++i)
                v->vocisc[i] = osrp2(&sc[i]);
        }
        else
            memcpy(v->vocisc, sc, (size_t)(numsc * sizeof(objnum)));
    }
    vocinh(ctx, obj) = v;                           /* set page table entry */
}